

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseCoDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *tol)

{
  uint *puVar1;
  int i;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  int *piVar4;
  undefined8 uVar5;
  int iVar6;
  DataKey DVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_178;
  DataKey local_140;
  ulong local_138;
  cpp_dec_float<50U,_int,_void> *local_130;
  cpp_dec_float<50U,_int,_void> local_128;
  pointer local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  steeppr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  uint local_48 [2];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f0 = (pSVar2->weights).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(pSVar2->infeasibilitiesCo).super_IdxSet.num;
  if (lVar8 < 1) {
    DVar7.info = 0;
    DVar7.idx = -1;
  }
  else {
    lVar8 = lVar8 + 1;
    local_138 = 0xffffffff;
    local_140.info = 0;
    local_140.idx = 0;
    local_130 = &best->m_backend;
    do {
      i = (((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver)->infeasibilitiesCo).super_IdxSet.idx[lVar8 + -2];
      local_178.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar3[i].m_backend.data + 0x20);
      local_178.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[i].m_backend.data;
      local_178.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[i].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[i].m_backend.data + 0x10);
      local_178.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar5 = *(undefined8 *)(puVar1 + 2);
      local_178.data._M_elems._24_5_ = SUB85(uVar5,0);
      local_178.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_178.exp = pnVar3[i].m_backend.exp;
      local_178.neg = pnVar3[i].m_backend.neg;
      local_178.fpclass = pnVar3[i].m_backend.fpclass;
      local_178.prec_elem = pnVar3[i].m_backend.prec_elem;
      local_128.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      local_128.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_128.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_128.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
      local_128.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
      local_128.exp = (tol->m_backend).exp;
      local_128.neg = (tol->m_backend).neg;
      local_128.fpclass = (tol->m_backend).fpclass;
      local_128.prec_elem = (tol->m_backend).prec_elem;
      if (local_128.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite) {
        local_128.neg = (bool)(local_128.neg ^ 1);
      }
      if (local_128.fpclass == cpp_dec_float_NaN || local_178.fpclass == cpp_dec_float_NaN) {
LAB_002c7b3f:
        pSVar2 = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        piVar4 = (pSVar2->infeasibilitiesCo).super_IdxSet.idx;
        iVar6 = (pSVar2->infeasibilitiesCo).super_IdxSet.num;
        (pSVar2->infeasibilitiesCo).super_IdxSet.num = iVar6 + -1;
        piVar4[lVar8 + -2] = piVar4[(long)iVar6 + -1];
        (pSVar2->isInfeasibleCo).data[i] = 0;
      }
      else {
        iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_178,&local_128);
        if (-1 < iVar6) goto LAB_002c7b3f;
        uStack_50 = CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
        local_68 = (steeppr  [8])local_178.data._M_elems._0_8_;
        auStack_60[0] = local_178.data._M_elems[2];
        auStack_60[1] = local_178.data._M_elems[3];
        local_58[0] = local_178.data._M_elems[4];
        local_58[1] = local_178.data._M_elems[5];
        local_48[0] = local_178.data._M_elems[8];
        local_48[1] = local_178.data._M_elems[9];
        local_40 = local_178.exp;
        local_3c = local_178.neg;
        local_38 = local_178.fpclass;
        iStack_34 = local_178.prec_elem;
        local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_f0[i].m_backend.data;
        local_a8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_f0[i].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_f0[i].m_backend.data + 0x10);
        local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&local_f0[i].m_backend.data + 0x20);
        local_a8.m_backend.exp = local_f0[i].m_backend.exp;
        local_a8.m_backend.neg = local_f0[i].m_backend.neg;
        local_a8.m_backend.fpclass = local_f0[i].m_backend.fpclass;
        local_a8.m_backend.prec_elem = local_f0[i].m_backend.prec_elem;
        local_e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 8);
        local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
        local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2)
        ;
        local_e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 4);
        local_e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((tol->m_backend).data._M_elems + 6);
        local_e8.m_backend.exp = (tol->m_backend).exp;
        local_e8.m_backend.neg = (tol->m_backend).neg;
        local_e8.m_backend.fpclass = (tol->m_backend).fpclass;
        local_e8.m_backend.prec_elem = (tol->m_backend).prec_elem;
        steeppr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_128,local_68,&local_a8,&local_e8,in_R8);
        local_178.data._M_elems[8] = local_128.data._M_elems[8];
        local_178.data._M_elems[9] = local_128.data._M_elems[9];
        local_178.data._M_elems[4] = local_128.data._M_elems[4];
        local_178.data._M_elems[5] = local_128.data._M_elems[5];
        local_178.data._M_elems._24_5_ = local_128.data._M_elems._24_5_;
        local_178.data._M_elems[7]._1_3_ = local_128.data._M_elems[7]._1_3_;
        local_178.data._M_elems[0] = local_128.data._M_elems[0];
        local_178.data._M_elems[1] = local_128.data._M_elems[1];
        local_178.data._M_elems[2] = local_128.data._M_elems[2];
        local_178.data._M_elems[3] = local_128.data._M_elems[3];
        local_178.exp = local_128.exp;
        local_178.neg = local_128.neg;
        local_178.fpclass = local_128.fpclass;
        local_178.prec_elem = local_128.prec_elem;
        if ((local_128.fpclass != cpp_dec_float_NaN) && (local_130->fpclass != cpp_dec_float_NaN)) {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_178,local_130);
          if (0 < iVar6) {
            *(undefined8 *)
             ((((cpp_dec_float<50U,_int,_void> *)&local_130->data)->data)._M_elems + 8) =
                 local_178.data._M_elems._32_8_;
            *(undefined8 *)
             ((((cpp_dec_float<50U,_int,_void> *)&local_130->data)->data)._M_elems + 4) =
                 local_178.data._M_elems._16_8_;
            *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_130->data)->data)._M_elems + 6) =
                 CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
            *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_130->data)->data)._M_elems =
                 local_178.data._M_elems._0_8_;
            *(undefined8 *)
             ((((cpp_dec_float<50U,_int,_void> *)&local_130->data)->data)._M_elems + 2) =
                 local_178.data._M_elems._8_8_;
            local_130->exp = local_178.exp;
            local_130->neg = local_178.neg;
            local_130->fpclass = local_178.fpclass;
            local_130->prec_elem = local_178.prec_elem;
            local_140 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::id((this->
                                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).thesolver,i);
            local_138 = (ulong)local_140 >> 0x20;
          }
        }
      }
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
    DVar7 = (DataKey)((ulong)local_140 & 0xffffffff | local_138 << 0x20);
  }
  return (SPxId)DVar7;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterSparseCoDim(R& best, R tol)
{
   SPxId enterId;
   const R* test          = this->thesolver->test().get_const_ptr();
   const R* weights_ptr   = this->thesolver->weights.get_const_ptr();

   int idx;
   R x;

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, weights_ptr[idx], tol);

         if(x > best)
         {
            best   = x;
            enterId = this->thesolver->id(idx);
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   return enterId;
}